

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
pipe_organ_fn::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          pipe_organ_fn *this,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pcVar1 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pcVar2 - (long)pcVar1;
  std::
  __reverse<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
            (pcVar1 + lVar3 / 2,pcVar2,lVar3 % 2);
  pcVar1 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end());
        std::reverse(c.begin() + std::distance(c.begin(), c.end()) / 2, c.end());
        return c;
    }